

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

DoubleComplex NGA_Zdot_patch(int g_a,char t_a,int *alo,int *ahi,int g_b,char t_b,int *blo,int *bhi)

{
  Integer IVar1;
  Integer IVar2;
  Integer *pIVar3;
  long lVar4;
  long lVar5;
  char t_b_local;
  char t_a_local;
  long local_140;
  DoubleComplex res;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  local_140 = (long)g_a;
  t_b_local = t_b;
  t_a_local = t_a;
  IVar1 = pnga_ndim(local_140);
  IVar2 = pnga_ndim((long)g_b);
  lVar5 = 0;
  lVar4 = 0;
  if (0 < IVar1) {
    lVar4 = IVar1;
  }
  pIVar3 = _ga_alo + IVar1 + -1;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = (long)alo[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pIVar3 = _ga_ahi + IVar1 + -1;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = (long)ahi[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  lVar5 = 0;
  lVar4 = 0;
  if (0 < IVar2) {
    lVar4 = IVar2;
  }
  pIVar3 = _ga_blo + IVar2 + -1;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = (long)blo[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pIVar3 = _ga_bhi + IVar2 + -1;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = (long)bhi[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pnga_dot_patch(local_140,&t_a_local,_ga_alo,_ga_ahi,(long)g_b,&t_b_local,_ga_blo,_ga_bhi,&res);
  return res;
}

Assistant:

DoubleComplex NGA_Zdot_patch(int g_a, char t_a, int alo[], int ahi[],
                             int g_b, char t_b, int blo[], int bhi[])
{
    DoubleComplex res;
    
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);
    
    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
    
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    
    wnga_dot_patch(a, &t_a, _ga_alo, _ga_ahi,
                   b, &t_b, _ga_blo, _ga_bhi, &res);
    
    return res;
}